

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrSpatialAnchorPersistenceInfoMSFT *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *piVar4;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  string type_prefix;
  string spatialanchor_prefix;
  string spatialanchorpersistencename_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [32];
  string local_1e8;
  string local_1c8;
  ostringstream oss_spatialAnchor;
  uint auStack_190 [2];
  PFN_xrGetReferenceSpaceBoundsRect local_188;
  PFN_xrCreateActionSpace p_Stack_180;
  PFN_xrLocateSpace local_178;
  PFN_xrDestroySpace p_Stack_170;
  
  PointerToHexString<XrSpatialAnchorPersistenceInfoMSFT>
            ((XrSpatialAnchorPersistenceInfoMSFT *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_spatialAnchor
            );
  std::__cxx11::string::~string((string *)&oss_spatialAnchor);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_spatialAnchor,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_spatialAnchor);
    std::__cxx11::string::~string((string *)&oss_spatialAnchor);
  }
  else {
    local_178 = (PFN_xrLocateSpace)0x0;
    p_Stack_170 = (PFN_xrDestroySpace)0x0;
    local_188 = (PFN_xrGetReferenceSpaceBoundsRect)0x0;
    p_Stack_180 = (PFN_xrCreateActionSpace)0x0;
    auStack_190[0] = 0;
    auStack_190[1] = 0;
    _oss_spatialAnchor = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_spatialAnchor);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_spatialAnchor);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_1c8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_1c8,contents);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&spatialanchorpersistencename_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&spatialanchorpersistencename_prefix);
    std::__cxx11::string::string
              ((string *)(local_208 + 0x20),(string *)&spatialanchorpersistencename_prefix);
    gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_208;
    std::__cxx11::string::string
              ((string *)gen_dispatch_table_00,"XrSpatialAnchorPersistenceNameMSFT",
               (allocator *)&oss_spatialAnchor);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table_00,&value->spatialAnchorPersistenceName,
                       (string *)(local_208 + 0x20),(string *)local_208,false,contents);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::~string((string *)(local_208 + 0x20));
    if (bVar2) {
      std::__cxx11::string::string((string *)&spatialanchor_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&spatialanchor_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_spatialAnchor);
      *(uint *)((long)auStack_190 + *(long *)(_oss_spatialAnchor + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(_oss_spatialAnchor + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(&oss_spatialAnchor);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[20],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [20])"XrSpatialAnchorMSFT",&spatialanchor_prefix,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_spatialAnchor);
      std::__cxx11::string::~string((string *)&spatialanchor_prefix);
      std::__cxx11::string::~string((string *)&spatialanchorpersistencename_prefix);
      std::__cxx11::string::~string((string *)&next_prefix);
      std::__cxx11::string::~string((string *)&type_prefix);
      return true;
    }
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpatialAnchorPersistenceInfoMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string spatialanchorpersistencename_prefix = prefix;
        spatialanchorpersistencename_prefix += "spatialAnchorPersistenceName";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->spatialAnchorPersistenceName, spatialanchorpersistencename_prefix, "XrSpatialAnchorPersistenceNameMSFT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string spatialanchor_prefix = prefix;
        spatialanchor_prefix += "spatialAnchor";
        std::ostringstream oss_spatialAnchor;
        oss_spatialAnchor << std::hex << reinterpret_cast<const void*>(value->spatialAnchor);
        contents.emplace_back("XrSpatialAnchorMSFT", spatialanchor_prefix, oss_spatialAnchor.str());
        return true;
    } catch(...) {
    }
    return false;
}